

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::AltNode::AnnotatePass4(AltNode *this,Compiler *compiler)

{
  undefined1 *puVar1;
  Node *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  CharSet<char16_t> *pCVar10;
  RuntimeCharTrie *this_01;
  uint uVar11;
  AltNode *curr;
  AltNode *pAVar12;
  byte bVar13;
  AltNode *curr_3;
  undefined8 uVar14;
  byte bVar15;
  CompilationScheme CVar16;
  AltNode *curr_2;
  AltNode *pAVar17;
  int iVar18;
  undefined1 local_78 [8];
  CharSet<char16_t> unionSet;
  uint local_44;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  uVar11 = *(uint *)&(this->super_Node).field_0xc;
  pAVar12 = this;
  if ((~uVar11 & 6) == 0) {
    do {
      pAVar17 = pAVar12;
      if (pAVar17 == (AltNode *)0x0) goto LAB_00d12d7e;
      pAVar12 = pAVar17->tail;
    } while (((pAVar17->head->field_0xc & 2) == 0) ||
            (pAVar12 = (AltNode *)0x0, pAVar17->tail == (AltNode *)0x0));
    pAVar17->tail = (AltNode *)0x0;
    if (((this->super_Node).field_0xc & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x8e9,"(!isFirstExact)","!isFirstExact");
      if (!bVar4) goto LAB_00d13185;
      *puVar9 = 0;
    }
    pCVar10 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,compiler->ctAllocator,0x35916e);
    CharSet<char16_t>::CharSet(pCVar10);
    (this->super_Node).firstSet = pCVar10;
    for (pAVar12 = this; pAVar12 != (AltNode *)0x0; pAVar12 = pAVar12->tail) {
      CharSet<char16_t>::UnionInPlace
                ((this->super_Node).firstSet,compiler->ctAllocator,pAVar12->head->firstSet);
    }
    uVar11 = *(uint *)&(this->super_Node).field_0xc;
  }
LAB_00d12d7e:
  *(uint *)&(this->super_Node).field_0xc = uVar11 | 0x200;
  for (pAVar12 = this; pAVar12 != (AltNode *)0x0; pAVar12 = pAVar12->tail) {
    (*pAVar12->head->_vptr_Node[10])(pAVar12->head,compiler);
    if ((pAVar12->head->field_0xd & 2) == 0) {
      puVar1 = &(this->super_Node).field_0xd;
      *puVar1 = *puVar1 & 0xfd;
    }
  }
  iVar18 = 0;
  bVar13 = 1;
  bVar15 = 1;
  uVar11 = 0;
  unionSet.rep._32_8_ = compiler;
  for (pAVar12 = this; pAVar12 != (AltNode *)0x0; pAVar12 = pAVar12->tail) {
    this_00 = pAVar12->head;
    if ((this_00->thisConsumes).lower == 0) goto LAB_00d12e8e;
    iVar18 = iVar18 + 1;
    bVar13 = bVar13 & (this_00->firstSet->rep).compact.countPlusOne - 1 < 5;
    bVar4 = Node::IsSimpleOneChar(this_00);
    bVar15 = bVar15 & bVar4;
    uVar7 = CharSet<char16_t>::Count(pAVar12->head->firstSet);
    uVar11 = uVar11 + uVar7;
  }
  if (iVar18 < 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x925,"(numItems > 1)","numItems > 1");
    if (!bVar4) goto LAB_00d13185;
    *puVar9 = 0;
  }
  uVar7 = CharSet<char16_t>::Count((this->super_Node).firstSet);
  if (uVar11 == uVar7) {
    if (bVar15 == 0) {
      if ((bool)(bVar13 & uVar11 < 0x19)) {
        this->scheme = Switch;
        this->switchSize = uVar11;
      }
      else {
        this->scheme = Chain;
      }
    }
    else {
      this->scheme = Set;
    }
    this->isOptional = false;
    return;
  }
LAB_00d12e8e:
  bVar3 = true;
  bVar4 = true;
  bVar6 = false;
  bVar13 = 1;
  iVar18 = 0;
  local_44 = 0;
  CVar16 = Set;
  for (pAVar12 = this; uVar14 = unionSet.rep._32_8_, pAVar17 = this, pAVar12 != (AltNode *)0x0;
      pAVar12 = pAVar12->tail) {
    bVar5 = Node::IsEmptyOnly(pAVar12->head);
    if (bVar5) {
      bVar6 = true;
    }
    else {
      uVar14 = unionSet.rep._32_8_;
      if ((pAVar12->head->thisConsumes).lower == 0) goto LAB_00d12f5e;
      iVar18 = iVar18 + 1;
      bVar5 = Node::IsSimpleOneChar(pAVar12->head);
      bVar4 = bVar3;
      if (!bVar5) {
        bVar4 = false;
      }
      pCVar10 = pAVar12->head->firstSet;
      bVar13 = bVar13 & (pCVar10->rep).compact.countPlusOne - 1 < 5;
      uVar7 = CharSet<char16_t>::Count(pCVar10);
      local_44 = local_44 + uVar7;
      bVar3 = bVar4;
    }
  }
  if (!bVar6) goto LAB_00d12f5e;
  if (iVar18 == 0) {
    CVar16 = None;
  }
  else {
    if (((((this->super_Node).field_0xc & 4) == 0) || (!bVar4)) ||
       (uVar7 = CharSet<char16_t>::Count((this->super_Node).firstSet), local_44 != uVar7)) {
      if ((this->super_Node).followConsumes.lower != 0) {
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)local_78);
        CharSet<char16_t>::UnionInPlace
                  ((CharSet<char16_t> *)local_78,*(ArenaAllocator **)(uVar14 + 8),
                   (this->super_Node).firstSet);
        CharSet<char16_t>::UnionInPlace
                  ((CharSet<char16_t> *)local_78,*(ArenaAllocator **)(uVar14 + 8),
                   (this->super_Node).followSet);
        uVar7 = CharSet<char16_t>::Count((this->super_Node).followSet);
        uVar8 = CharSet<char16_t>::Count((CharSet<char16_t> *)local_78);
        if (uVar7 + local_44 == uVar8) {
          if (bVar4) {
            CVar16 = Set;
          }
          else {
            CVar16 = Chain;
            if (((bool)(1 < iVar18 & bVar13)) && (local_44 < 0x19)) {
              this->switchSize = local_44;
              CVar16 = Switch;
            }
          }
          goto LAB_00d1316d;
        }
      }
LAB_00d12f5e:
      do {
        if (pAVar17 == (AltNode *)0x0) goto LAB_00d12f8d;
        local_78._0_4_ = 1;
        iVar18 = (*pAVar17->head->_vptr_Node[0x14])(pAVar17->head,uVar14);
        if (((char)iVar18 == '\0') || (0x10 < (uint)local_78._0_4_)) goto LAB_00d12fda;
        pAVar17 = pAVar17->tail;
      } while( true );
    }
    CVar16 = Set;
  }
LAB_00d1316d:
  this->scheme = CVar16;
  this->isOptional = true;
  return;
LAB_00d12f8d:
  local_78 = (undefined1  [8])0x0;
  unionSet.rep.compact.countPlusOne._0_1_ = 0;
  unionSet.rep._4_8_ = 0;
  for (pAVar12 = this; pAVar12 != (AltNode *)0x0; pAVar12 = pAVar12->tail) {
    iVar18 = (*pAVar12->head->_vptr_Node[0x15])
                       (pAVar12->head,uVar14,local_78,0,
                        (ulong)((*(uint *)&(this->super_Node).field_0xc & 4) >> 2));
    if ((char)iVar18 == '\0') {
LAB_00d12fda:
      this->scheme = Try;
      puVar1 = &(this->super_Node).field_0xd;
      *puVar1 = *puVar1 & 0xfd;
      return;
    }
  }
  bVar4 = CharTrie::IsDepthZero((CharTrie *)local_78);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x9e1,"(!trie.IsDepthZero())","!trie.IsDepthZero()");
    if (!bVar4) {
LAB_00d13185:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  bVar4 = CharTrie::IsDepthOne((CharTrie *)local_78);
  if (bVar4) {
    this->isOptional = false;
  }
  else {
    this_01 = (RuntimeCharTrie *)
              new<Memory::ArenaAllocator>(0x10,*(ArenaAllocator **)(uVar14 + 8),0x35916e);
    this_01->count = 0;
    this_01->children = (RuntimeCharTrieEntry *)0x0;
    this->runtimeTrie = this_01;
    RuntimeCharTrie::CloneFrom
              (this_01,*(ScriptContext **)uVar14,*(ArenaAllocator **)(uVar14 + 0x10),
               (CharTrie *)local_78);
    CVar16 = Trie;
  }
  this->scheme = CVar16;
  return;
}

Assistant:

void AltNode::AnnotatePass4(Compiler& compiler)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        //
        // Simplification rule
        //
        // If the follow is irrefutable then we can ignore all items after an irrefutable item, since
        // we'll never be able to backtrack into them.
        // E.g.: (a*|b*)c* === a*c*
        //

        bool simplified = false;
        if (isFollowIrrefutable && isThisIrrefutable)
        {
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->isThisIrrefutable && curr->tail != 0)
                {
                    curr->tail = 0;
                    simplified = true;
                    break;
                }
            }
        }

        if (simplified)
        {
            Assert(!isFirstExact);
            // Recalculate firstSet. Since it can only get smaller, and alternative could not have had an exact
            // first set, this recalculation does not make any decisions already made based on the current firstSet
            // unsound.
            // NOTE: Is it worth recalculating the WillNotProgress/WillNotRegress bools?
            firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
                firstSet->UnionInPlace(compiler.ctAllocator, *curr->head->firstSet);
        }

        //
        // Annotate items
        //
        isDeterministic = true;
        for (AltNode* curr = this; curr != 0; curr = curr->tail)
        {
            curr->head->AnnotatePass4(compiler);
            if (!curr->head->isDeterministic)
                isDeterministic = false;
        }

        //
        // Compilation scheme: Switch/Chain/Set, not isOptional
        //
        // If no item can match empty and all items' FIRST sets are pairwise disjoint then we can
        // commit to an item using a 1 char lookahead. We can fall-through to the last
        // item without guarding it since it will fail if the next character cannot match.
        // E.g.: (abc|def)
        //

        {
            // Pass 1: Items cannot match empty, accumulate counts
            bool fires = true;
            bool allCompact = true;
            bool allSimpleOneChar = true;
            int numItems = 0;
            uint totalChars = 0;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->thisConsumes.CouldMatchEmpty())
                {
                    fires = false;
                    break;
                }
                numItems++;
                if (!curr->head->firstSet->IsCompact())
                {
                    allCompact = false;
                }
                if (!curr->head->IsSimpleOneChar())
                {
                    allSimpleOneChar = false;
                }
                totalChars += curr->head->firstSet->Count();
            }

            if (fires)
            {
                // To go from two to one items requires the first item
                // to be irrefutable, in which case it could match empty and this rule won't fire.
                Assert(numItems > 1);
                // Step 2: Check FIRST sets are disjoint
                if (totalChars == firstSet->Count())
                {
                    // **COMMIT**
                    if (allSimpleOneChar)
                    {
                        // This will probably never fire since the parser has already converted alts-of-chars/sets
                        // to sets. We include it for symmetry with below.
                        scheme = Set;
                    }
                    else if (allCompact && totalChars <= Switch24Inst::MaxCases)
                    {
                        // Can use a switch instruction to jump to item
                        scheme = Switch;
                        switchSize = totalChars;
                    }
                    else
                    {
                        // Must use a chain of jump instructions to jump to item
                        scheme = Chain;
                    }
                    isOptional = false;
                    return;
                }
            }
        }

        //
        // Compilation scheme: None/Switch/Chain/Set, isOptional
        //
        // Condition (1):
        // If some items are empty-only, the rest (if any) cannot match empty, follow cannot match empty, and
        // all items' FIRST sets are pairwise disjoint and disjoint from the FOLLOW set, then we can commit to
        // either a non-empty item or to the empty item using a 1 char lookahead. In this case we just emit each
        // non-empty item with a guard, and fall-through to follow if no guard fires.
        // E.g.: (abc||def)h
        //
        // Condition (2):
        // If some items are empty-only, the rest (if any) cannot match empty, follow is irrefutable, and all
        // items' FIRST sets are pairwise disjoint, then we can commit to either a non-empty item or to the empty
        // item using a 1 char lookahead, provided each non-empty item obeys the condition:
        //   ** the item can't fail if given an arbitrary input starting with a character in its FIRST set **
        // Currently, we can prove that only for IsSimpleOneChar items, though more analysis could widen the class.
        // Again, we emit each non-empty item with a guard, and fall-through to follow if no guard fires.
        // E.g.: ([abc]|)a*
        //
        // Condition (3):
        // If all items are empty-only, we can commit to a single empty-only item

        {
            // Pass 1
            bool fires = false;
            bool allSimpleOneChar = true;
            bool allCompact = true;
            int numNonEmpty = 0;
            uint totalChars = 0;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->IsEmptyOnly())
                {
                    fires = true;
                }
                else if (curr->head->thisConsumes.CouldMatchEmpty())
                {
                    fires = false;
                    break;
                }
                else
                {
                    numNonEmpty++;
                    if (!curr->head->IsSimpleOneChar())
                    {
                        allSimpleOneChar = false;
                    }
                    if (!curr->head->firstSet->IsCompact())
                    {
                        allCompact = false;
                    }
                    totalChars += curr->head->firstSet->Count();
                }
            }

            if (fires)
            {
                // The firing condition is not strong enough yet.
                fires = false;
                // Check conditions (2) and (3) first because they're faster, then check condition (1).
                if (numNonEmpty == 0 ||
                    (isFollowIrrefutable && allSimpleOneChar && totalChars == firstSet->Count()))
                {
                    fires = true;
                }
                else if (!followConsumes.CouldMatchEmpty())
                {
                    // Check whether all FIRST sets are pairwise disjoint
                    // and disjoint from the FOLLOW set.
                    CharSet<Char> unionSet;
                    unionSet.UnionInPlace(compiler.ctAllocator, *firstSet);
                    unionSet.UnionInPlace(compiler.ctAllocator, *followSet);
                    if (totalChars + followSet->Count() == unionSet.Count())
                    {
                        fires = true;
                    }
                }

                if (fires)
                {
                    // **COMMIT**
                    if (numNonEmpty == 0)
                    {
                        scheme = None;
                    }
                    else if (allSimpleOneChar)
                    {
                        scheme = Set;
                    }
                    else if (numNonEmpty > 1 && allCompact && totalChars <= Switch24Inst::MaxCases)
                    {
                        switchSize = totalChars;
                        scheme = Switch;
                    }
                    else
                    {
                        scheme = Chain;
                    }
                    isOptional = true;
                    return;
                }
            }
        }

        //
        // Compilation scheme: Trie
        //
        // If alt is equivalent to the form:
        //   (literal1|...|literaln)
        // (we expand items with embedded character classes such as a[bc]d to (abd|acd)) and either:
        //  - follow is irrefutable and no later literal is a proper prefix of an earlier literal
        //    (and we may ignore later literals which have an earlier literal as proper prefix)
        //    E.g.: (ab|ac|abd)a* === (ab|ac)a*
        // or:
        //  - follow is not irrefutable and no literal is a proper prefix of any other literal
        //    and the branching factor of the resulting trie is smallish
        //    E.g.: (abc|abd|abe)f
        // then we can use a character trie to match the appropriate item.
        //

        {
            // Pass 1: Items must be structurally appropriate and not result in too many alternatives after expansion
            bool fires = true;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                uint numAlts = 1;
                if (!curr->head->IsCharTrieArm(compiler, numAlts))
                {
                    fires = false;
                    break;
                }
                if (numAlts > maxTrieArmExpansion)
                {
                    fires = false;
                    break;
                }
            }

            if (fires)
            {
                // Pass 2: Attempt to construct the trie, checking for prefixes.
                CharTrie trie;
                for (AltNode* curr = this; curr != 0; curr = curr->tail)
                {
                    if (!curr->head->BuildCharTrie(compiler, &trie, 0, isFollowIrrefutable))
                    {
                        fires = false;
                        break;
                    }
                }

                if (fires)
                {
                    // **COMMIT**
                    // If follow is irrefutable and first item is empty, the trie would be of depth zero.
                    // However, in this case, the first simplification rule would have replaced the alt with a
                    // single empty item, and the 'None' compilation scheme would have been selected above.
                    //
                    // Similarly, if all alternations are empty and follow is refutable, the trie would be
                    // of depth zero, and the 'None' compilation scheme would have been selected above.
                    Assert(!trie.IsDepthZero());
                    if (trie.IsDepthOne())
                    {
                        // This case will fire if follow is irrefutable and all non length one items have an
                        // earlier one-character item as prefix. In this case we don't need the trie: the
                        // firstSet has all the information.
                        isOptional = false;
                        scheme = Set;
                    }
                    else
                    {
                        // Root of trie will live in compile-time allocator, but body will be in run-time allocator
                        runtimeTrie = Anew(compiler.ctAllocator, RuntimeCharTrie);
                        runtimeTrie->CloneFrom(compiler.scriptContext, compiler.rtAllocator, trie);
                        scheme = Trie;
                    }
                    return;
                }
            }
        }

        //
        // Compilation scheme: Try
        //

        scheme = Try;
        isDeterministic = false; // NON-DETERMINISTIC
    }